

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::splitBuiltIn
          (HlslParseContext *this,TString *baseName,TType *memberType,TArraySizes *arraySizes,
          TQualifier *outerQualifier)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TVariable *pTVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  mapped_type *ppTVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TQualifier *dst;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long lVar6;
  tInterstageIoData local_a8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_78;
  TVariable *local_50;
  TVariable *ioVar;
  tInterstageIoData local_40;
  _Self local_38;
  TQualifier *local_30;
  TQualifier *outerQualifier_local;
  TArraySizes *arraySizes_local;
  TType *memberType_local;
  TString *baseName_local;
  HlslParseContext *this_local;
  
  local_30 = outerQualifier;
  outerQualifier_local = (TQualifier *)arraySizes;
  arraySizes_local = (TArraySizes *)memberType;
  memberType_local = (TType *)baseName;
  baseName_local = (TString *)this;
  bVar1 = isClipOrCullDistance(memberType);
  if (!bVar1) {
    iVar2 = (*(arraySizes_local->sizes)._vptr_TSmallArrayVector[0xb])();
    tInterstageIoData::tInterstageIoData
              (&local_40,
               (TBuiltInVariable)(*(ulong *)(CONCAT44(extraout_var,iVar2) + 8) >> 7) & 0x1ff,
               (TStorageQualifier)*(undefined8 *)&local_30->field_0x8 & 0x7f);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
         ::find(&(this->splitBuiltIns).
                 super_map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
                ,&local_40);
    ioVar = (TVariable *)
            std::
            map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
            ::end(&(this->splitBuiltIns).
                   super_map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
                 );
    bVar1 = std::operator!=(&local_38,(_Self *)&ioVar);
    if (bVar1) {
      return;
    }
  }
  std::operator+(&local_a0,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 memberType_local,".");
  iVar2 = (*(arraySizes_local->sizes)._vptr_TSmallArrayVector[6])();
  std::operator+(&local_78,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 CONCAT44(extraout_var_00,iVar2));
  pTVar4 = makeInternalVariable(this,&local_78,(TType *)arraySizes_local);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_78);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_a0);
  local_50 = pTVar4;
  if ((outerQualifier_local != (TQualifier *)0x0) &&
     (uVar3 = (*(arraySizes_local->sizes)._vptr_TSmallArrayVector[0x1d])(), (uVar3 & 1) == 0)) {
    iVar2 = (*(local_50->super_TSymbol)._vptr_TSymbol[0xd])();
    TType::copyArraySizes
              ((TType *)CONCAT44(extraout_var_01,iVar2),(TArraySizes *)outerQualifier_local);
  }
  pTVar4 = local_50;
  iVar2 = (*(arraySizes_local->sizes)._vptr_TSmallArrayVector[0xb])();
  tInterstageIoData::tInterstageIoData
            (&local_a8,
             (TBuiltInVariable)(*(ulong *)(CONCAT44(extraout_var_02,iVar2) + 8) >> 7) & 0x1ff,
             (TStorageQualifier)*(undefined8 *)&local_30->field_0x8 & 0x7f);
  ppTVar5 = std::
            map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
            ::operator[](&(this->splitBuiltIns).
                          super_map<glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*,_std::less<glslang::HlslParseContext::tInterstageIoData>,_glslang::pool_allocator<std::pair<const_glslang::HlslParseContext::tInterstageIoData,_glslang::TVariable_*>_>_>
                         ,&local_a8);
  *ppTVar5 = pTVar4;
  iVar2 = (*(local_50->super_TSymbol)._vptr_TSymbol[0xc])();
  bVar1 = isClipOrCullDistance((TType *)CONCAT44(extraout_var_03,iVar2));
  if (!bVar1) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
              (this,local_50);
  }
  iVar2 = (*(local_50->super_TSymbol)._vptr_TSymbol[0xd])();
  dst = (TQualifier *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0x50))();
  mergeQualifiers(this,dst,local_30);
  iVar2 = (*(local_50->super_TSymbol)._vptr_TSymbol[0xd])();
  fixBuiltInIoType(this,(TType *)CONCAT44(extraout_var_05,iVar2));
  iVar2 = (*(local_50->super_TSymbol)._vptr_TSymbol[0xd])();
  lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar2) + 0x50))();
  *(ulong *)(lVar6 + 0x1c) = *(ulong *)(lVar6 + 0x1c) & 0xfffffffffffff000 | 0xfff;
  return;
}

Assistant:

void HlslParseContext::splitBuiltIn(const TString& baseName, const TType& memberType, const TArraySizes* arraySizes,
                                    const TQualifier& outerQualifier)
{
    // Because of arrays of structs, we might be asked more than once,
    // but the arraySizes passed in should have captured the whole thing
    // the first time.
    // However, clip/cull rely on multiple updates.
    if (!isClipOrCullDistance(memberType))
        if (splitBuiltIns.find(tInterstageIoData(memberType.getQualifier().builtIn, outerQualifier.storage)) !=
            splitBuiltIns.end())
            return;

    TVariable* ioVar = makeInternalVariable(baseName + "." + memberType.getFieldName(), memberType);

    if (arraySizes != nullptr && !memberType.isArray())
        ioVar->getWritableType().copyArraySizes(*arraySizes);

    splitBuiltIns[tInterstageIoData(memberType.getQualifier().builtIn, outerQualifier.storage)] = ioVar;
    if (!isClipOrCullDistance(ioVar->getType()))
        trackLinkage(*ioVar);

    // Merge qualifier from the user structure
    mergeQualifiers(ioVar->getWritableType().getQualifier(), outerQualifier);

    // Fix the builtin type if needed (e.g, some types require fixed array sizes, no matter how the
    // shader declared them).  This is done after mergeQualifiers(), in case fixBuiltInIoType looks
    // at the qualifier to determine e.g, in or out qualifications.
    fixBuiltInIoType(ioVar->getWritableType());

    // But, not location, we're losing that
    ioVar->getWritableType().getQualifier().layoutLocation = TQualifier::layoutLocationEnd;
}